

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall
TApp_MissingValueNonRequiredOpt_Test::TestBody(TApp_MissingValueNonRequiredOpt_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  int count;
  AssertHelper AStack_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [16];
  undefined1 local_70 [4];
  int local_6c;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"-c,--count","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  this_00 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_48,&local_6c,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_90[0].ptr_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"-c","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_90,
             local_70);
  if (local_90[0].ptr_ != local_80) {
    operator_delete(local_90[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_90);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x12a,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_90);
  testing::internal::AssertHelper::~AssertHelper(&AStack_98);
  if (local_90[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_90[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_90[0].ptr_ + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_90[0].ptr_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"--count","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_90,
             local_70);
  if (local_90[0].ptr_ != local_80) {
    operator_delete(local_90[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_90);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x12f,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_90);
  testing::internal::AssertHelper::~AssertHelper(&AStack_98);
  if (local_90[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_90[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_90[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(TApp, MissingValueNonRequiredOpt) {
    int count;
    app.add_option("-c,--count", count);

    args = {"-c"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--count"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}